

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  FILE *__stream;
  uchar *scratch_00;
  uchar *scratch;
  FILE *f;
  int i;
  float *data_local;
  int comp_local;
  int y_local;
  int x_local;
  char *filename_local;
  
  if (((y < 1) || (x < 1)) || (data == (float *)0x0)) {
    filename_local._4_4_ = 0;
  }
  else {
    __stream = fopen(filename,"wb");
    if (__stream != (FILE *)0x0) {
      scratch_00 = (uchar *)malloc((long)(x << 2));
      fprintf(__stream,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n");
      fprintf(__stream,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
              (ulong)(uint)x);
      for (f._4_4_ = 0; f._4_4_ < y; f._4_4_ = f._4_4_ + 1) {
        stbiw__write_hdr_scanline((FILE *)__stream,x,comp,scratch_00,data + comp * f._4_4_ * x);
      }
      free(scratch_00);
      fclose(__stream);
    }
    filename_local._4_4_ = (uint)(__stream != (FILE *)0x0);
  }
  return filename_local._4_4_;
}

Assistant:

int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   int i;
   FILE *f;
   if (y <= 0 || x <= 0 || data == NULL) return 0;
   f = fopen(filename, "wb");
   if (f) {
      /* Each component is stored separately. Allocate scratch space for full output scanline. */
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      fprintf(f, "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n"      );
      fprintf(f, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n"                 , y, x);
      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(f, x, comp, scratch, data + comp*i*x);
      STBIW_FREE(scratch);
      fclose(f);
   }
   return f != NULL;
}